

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int Fax3SetupState(TIFF *tif)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  void *pvVar3;
  bool bVar4;
  uint local_84;
  uint local_74;
  int local_68;
  int local_64;
  uint local_60;
  Fax3CodecState *esp;
  tmsize_t tStack_40;
  uint32_t rowpixels;
  tmsize_t rowbytes;
  Fax3CodecState *dsp;
  int needsRefLine;
  Fax3BaseState *sp;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  puVar2 = tif->tif_data;
  if ((tif->tif_dir).td_bitspersample == 1) {
    if ((tif->tif_flags & 0x400) == 0) {
      tStack_40 = TIFFScanlineSize(tif);
      esp._4_4_ = (tif->tif_dir).td_imagewidth;
    }
    else {
      tStack_40 = TIFFTileRowSize(tif);
      esp._4_4_ = (tif->tif_dir).td_tilewidth;
    }
    if (tStack_40 < (long)(((ulong)esp._4_4_ + 7) / 8)) {
      TIFFErrorExtR(tif,"Fax3SetupState",
                    "Inconsistent number of bytes per row : rowbytes=%ld rowpixels=%u",tStack_40,
                    (ulong)esp._4_4_);
    }
    else {
      *(tmsize_t *)(puVar1 + 8) = tStack_40;
      *(uint32_t *)(puVar1 + 0x10) = esp._4_4_;
      bVar4 = true;
      if ((*(uint *)(puVar1 + 0x20) & 1) == 0) {
        bVar4 = (tif->tif_dir).td_compression == 4;
      }
      puVar2[0x60] = '\0';
      puVar2[0x61] = '\0';
      puVar2[0x62] = '\0';
      puVar2[99] = '\0';
      puVar2[100] = '\0';
      puVar2[0x65] = '\0';
      puVar2[0x66] = '\0';
      puVar2[0x67] = '\0';
      if (esp._4_4_ + 1 < 0xffffffe0) {
        local_60 = esp._4_4_ + 0x20 >> 5;
      }
      else {
        local_60 = 0;
      }
      *(uint *)(puVar2 + 0x68) = local_60 << 5;
      if (bVar4) {
        if ((*(uint *)(puVar2 + 0x68) & 0x7fffffff) == *(uint *)(puVar2 + 0x68)) {
          local_64 = *(int *)(puVar2 + 0x68) << 1;
        }
        else {
          local_64 = 0;
        }
        *(int *)(puVar2 + 0x68) = local_64;
      }
      if (*(int *)(puVar2 + 0x68) != 0) {
        if ((*(uint *)(puVar2 + 0x68) & 0x7fffffff) == *(uint *)(puVar2 + 0x68)) {
          local_68 = *(int *)(puVar2 + 0x68) << 1;
        }
        else {
          local_68 = 0;
        }
        if (local_68 != 0) {
          if ((*(uint *)(puVar2 + 0x68) & 0x7fffffff) == *(uint *)(puVar2 + 0x68)) {
            local_74 = *(int *)(puVar2 + 0x68) << 1;
          }
          else {
            local_74 = 0;
          }
          pvVar3 = _TIFFCheckMalloc(tif,(ulong)local_74,4,"for Group 3/4 run arrays");
          *(void **)(puVar2 + 0x60) = pvVar3;
          if (*(long *)(puVar2 + 0x60) == 0) {
            return 0;
          }
          if ((*(uint *)(puVar2 + 0x68) & 0x7fffffff) == *(uint *)(puVar2 + 0x68)) {
            local_84 = *(int *)(puVar2 + 0x68) << 1;
          }
          else {
            local_84 = 0;
          }
          memset(*(void **)(puVar2 + 0x60),0,(ulong)local_84 << 2);
          *(undefined8 *)(puVar2 + 0x78) = *(undefined8 *)(puVar2 + 0x60);
          if (bVar4) {
            *(ulong *)(puVar2 + 0x70) =
                 *(long *)(puVar2 + 0x60) + (ulong)*(uint *)(puVar2 + 0x68) * 4;
          }
          else {
            puVar2[0x70] = '\0';
            puVar2[0x71] = '\0';
            puVar2[0x72] = '\0';
            puVar2[0x73] = '\0';
            puVar2[0x74] = '\0';
            puVar2[0x75] = '\0';
            puVar2[0x76] = '\0';
            puVar2[0x77] = '\0';
          }
          if (((tif->tif_dir).td_compression == 3) && ((*(uint *)(puVar2 + 0x20) & 1) != 0)) {
            tif->tif_decoderow = Fax3Decode2D;
            tif->tif_decodestrip = Fax3Decode2D;
            tif->tif_decodetile = Fax3Decode2D;
          }
          if (bVar4) {
            puVar1 = tif->tif_data;
            pvVar3 = _TIFFmallocExt(tif,tStack_40);
            *(void **)(puVar1 + 0x88) = pvVar3;
            if (*(long *)(puVar1 + 0x88) == 0) {
              TIFFErrorExtR(tif,"Fax3SetupState","No space for Group 3/4 reference line");
              return 0;
            }
          }
          else {
            puVar1 = tif->tif_data;
            puVar1[0x88] = '\0';
            puVar1[0x89] = '\0';
            puVar1[0x8a] = '\0';
            puVar1[0x8b] = '\0';
            puVar1[0x8c] = '\0';
            puVar1[0x8d] = '\0';
            puVar1[0x8e] = '\0';
            puVar1[0x8f] = '\0';
          }
          return 1;
        }
      }
      TIFFErrorExtR(tif,tif->tif_name,"Row pixels integer overflow (rowpixels %u)",(ulong)esp._4_4_)
      ;
    }
  }
  else {
    TIFFErrorExtR(tif,"Fax3SetupState","Bits/sample must be 1 for Group 3/4 encoding/decoding");
  }
  return 0;
}

Assistant:

static int Fax3SetupState(TIFF *tif)
{
    static const char module[] = "Fax3SetupState";
    TIFFDirectory *td = &tif->tif_dir;
    Fax3BaseState *sp = Fax3State(tif);
    int needsRefLine;
    Fax3CodecState *dsp = (Fax3CodecState *)Fax3State(tif);
    tmsize_t rowbytes;
    uint32_t rowpixels;

    if (td->td_bitspersample != 1)
    {
        TIFFErrorExtR(tif, module,
                      "Bits/sample must be 1 for Group 3/4 encoding/decoding");
        return (0);
    }
    /*
     * Calculate the scanline/tile widths.
     */
    if (isTiled(tif))
    {
        rowbytes = TIFFTileRowSize(tif);
        rowpixels = td->td_tilewidth;
    }
    else
    {
        rowbytes = TIFFScanlineSize(tif);
        rowpixels = td->td_imagewidth;
    }
    if ((int64_t)rowbytes < ((int64_t)rowpixels + 7) / 8)
    {
        TIFFErrorExtR(tif, module,
                      "Inconsistent number of bytes per row : rowbytes=%" PRId64
                      " rowpixels=%" PRIu32,
                      (int64_t)rowbytes, rowpixels);
        return (0);
    }
    sp->rowbytes = rowbytes;
    sp->rowpixels = rowpixels;
    /*
     * Allocate any additional space required for decoding/encoding.
     */
    needsRefLine = ((sp->groupoptions & GROUP3OPT_2DENCODING) ||
                    td->td_compression == COMPRESSION_CCITTFAX4);

    /*
      Assure that allocation computations do not overflow.

      TIFFroundup and TIFFSafeMultiply return zero on integer overflow
    */
    dsp->runs = (uint32_t *)NULL;
    dsp->nruns = TIFFroundup_32(rowpixels + 1, 32);
    if (needsRefLine)
    {
        dsp->nruns = TIFFSafeMultiply(uint32_t, dsp->nruns, 2);
    }
    if ((dsp->nruns == 0) || (TIFFSafeMultiply(uint32_t, dsp->nruns, 2) == 0))
    {
        TIFFErrorExtR(tif, tif->tif_name,
                      "Row pixels integer overflow (rowpixels %" PRIu32 ")",
                      rowpixels);
        return (0);
    }
    dsp->runs = (uint32_t *)_TIFFCheckMalloc(
        tif, TIFFSafeMultiply(uint32_t, dsp->nruns, 2), sizeof(uint32_t),
        "for Group 3/4 run arrays");
    if (dsp->runs == NULL)
        return (0);
    memset(dsp->runs, 0,
           TIFFSafeMultiply(uint32_t, dsp->nruns, 2) * sizeof(uint32_t));
    dsp->curruns = dsp->runs;
    if (needsRefLine)
        dsp->refruns = dsp->runs + dsp->nruns;
    else
        dsp->refruns = NULL;
    if (td->td_compression == COMPRESSION_CCITTFAX3 && is2DEncoding(dsp))
    { /* NB: default is 1D routine */
        tif->tif_decoderow = Fax3Decode2D;
        tif->tif_decodestrip = Fax3Decode2D;
        tif->tif_decodetile = Fax3Decode2D;
    }

    if (needsRefLine)
    { /* 2d encoding */
        Fax3CodecState *esp = EncoderState(tif);
        /*
         * 2d encoding requires a scanline
         * buffer for the ``reference line''; the
         * scanline against which delta encoding
         * is referenced.  The reference line must
         * be initialized to be ``white'' (done elsewhere).
         */
        esp->refline = (unsigned char *)_TIFFmallocExt(tif, rowbytes);
        if (esp->refline == NULL)
        {
            TIFFErrorExtR(tif, module, "No space for Group 3/4 reference line");
            return (0);
        }
    }
    else /* 1d encoding */
        EncoderState(tif)->refline = NULL;

    return (1);
}